

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void ptrmapPut(BtShared *pBt,Pgno key,u8 eType,Pgno parent,int *pRC)

{
  u8 *puVar1;
  uint uVar2;
  Pgno pgno;
  int iVar3;
  u32 uVar4;
  PgHdr *in_RAX;
  DbPage *pDbPage;
  PgHdr *local_38;
  
  if (*pRC == 0) {
    if (key == 0) {
      sqlite3CorruptError(0xd260);
      *pRC = 0xb;
    }
    else {
      local_38 = in_RAX;
      pgno = ptrmapPageno(pBt,key);
      iVar3 = sqlite3PagerAcquire(pBt->pPager,pgno,&local_38,0);
      if (iVar3 == 0) {
        uVar2 = (~pgno + key) * 5;
        if ((int)uVar2 < 0) {
          sqlite3CorruptError(0xd26b);
          *pRC = 0xb;
        }
        else {
          puVar1 = (u8 *)((long)local_38->pData + (ulong)uVar2);
          if (*(u8 *)((long)local_38->pData + (ulong)uVar2) == eType) {
            uVar4 = sqlite3Get4byte(puVar1 + 1);
            if (uVar4 == parent) goto LAB_0012450c;
          }
          iVar3 = sqlite3PagerWrite(local_38);
          *pRC = iVar3;
          if (iVar3 == 0) {
            *puVar1 = eType;
            puVar1[1] = (u8)(parent >> 0x18);
            puVar1[2] = (u8)(parent >> 0x10);
            puVar1[3] = (u8)(parent >> 8);
            puVar1[4] = (u8)parent;
          }
        }
LAB_0012450c:
        sqlite3PagerUnref(local_38);
        return;
      }
      *pRC = iVar3;
    }
  }
  return;
}

Assistant:

static void ptrmapPut(BtShared *pBt, Pgno key, u8 eType, Pgno parent, int *pRC){
  DbPage *pDbPage;  /* The pointer map page */
  u8 *pPtrmap;      /* The pointer map data */
  Pgno iPtrmap;     /* The pointer map page number */
  int offset;       /* Offset in pointer map page */
  int rc;           /* Return code from subfunctions */

  if( *pRC ) return;

  assert( sqlite3_mutex_held(pBt->mutex) );
  /* The master-journal page number must never be used as a pointer map page */
  assert( 0==PTRMAP_ISPAGE(pBt, PENDING_BYTE_PAGE(pBt)) );

  assert( pBt->autoVacuum );
  if( key==0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage);
  if( rc!=SQLITE_OK ){
    *pRC = rc;
    return;
  }
  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    *pRC = SQLITE_CORRUPT_BKPT;
    goto ptrmap_exit;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  if( eType!=pPtrmap[offset] || get4byte(&pPtrmap[offset+1])!=parent ){
    TRACE(("PTRMAP_UPDATE: %d->(%d,%d)\n", key, eType, parent));
    *pRC= rc = sqlite3PagerWrite(pDbPage);
    if( rc==SQLITE_OK ){
      pPtrmap[offset] = eType;
      put4byte(&pPtrmap[offset+1], parent);
    }
  }

ptrmap_exit:
  sqlite3PagerUnref(pDbPage);
}